

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_radix_tree.c
# Opt level: O0

ngx_int_t ngx_radix128tree_delete(ngx_radix_tree_t *tree,u_char *key,u_char *mask)

{
  bool bVar1;
  ngx_radix_node_t *local_40;
  ngx_radix_node_t *node;
  ngx_uint_t i;
  u_char bit;
  u_char *mask_local;
  u_char *key_local;
  ngx_radix_tree_t *tree_local;
  
  node = (ngx_radix_node_t *)0x0;
  i._7_1_ = 0x80;
  local_40 = tree->root;
  while( true ) {
    bVar1 = false;
    if (local_40 != (ngx_radix_node_t *)0x0) {
      bVar1 = (i._7_1_ & mask[(long)node]) != 0;
    }
    if (!bVar1) break;
    if ((key[(long)node] & i._7_1_) == 0) {
      local_40 = local_40->left;
    }
    else {
      local_40 = local_40->right;
    }
    i._7_1_ = (byte)((int)(uint)i._7_1_ >> 1);
    if (i._7_1_ == 0) {
      node = (ngx_radix_node_t *)((long)&node->right + 1);
      if (node == (ngx_radix_node_t *)0x10) break;
      i._7_1_ = 0x80;
    }
  }
  if (local_40 == (ngx_radix_node_t *)0x0) {
    tree_local = (ngx_radix_tree_t *)0xffffffffffffffff;
  }
  else if ((local_40->right == (ngx_radix_node_t *)0x0) &&
          (local_40->left == (ngx_radix_node_t *)0x0)) {
    do {
      if (local_40->parent->right == local_40) {
        local_40->parent->right = (ngx_radix_node_t *)0x0;
      }
      else {
        local_40->parent->left = (ngx_radix_node_t *)0x0;
      }
      local_40->right = tree->free;
      tree->free = local_40;
      local_40 = local_40->parent;
    } while ((((local_40->right == (ngx_radix_node_t *)0x0) &&
              (local_40->left == (ngx_radix_node_t *)0x0)) &&
             (local_40->value == 0xffffffffffffffff)) &&
            (local_40->parent != (ngx_radix_node_t *)0x0));
    tree_local = (ngx_radix_tree_t *)0x0;
  }
  else if (local_40->value == 0xffffffffffffffff) {
    tree_local = (ngx_radix_tree_t *)0xffffffffffffffff;
  }
  else {
    local_40->value = 0xffffffffffffffff;
    tree_local = (ngx_radix_tree_t *)0x0;
  }
  return (ngx_int_t)tree_local;
}

Assistant:

ngx_int_t
ngx_radix128tree_delete(ngx_radix_tree_t *tree, u_char *key, u_char *mask)
{
    u_char             bit;
    ngx_uint_t         i;
    ngx_radix_node_t  *node;

    i = 0;
    bit = 0x80;
    node = tree->root;

    while (node && (bit & mask[i])) {
        if (key[i] & bit) {
            node = node->right;

        } else {
            node = node->left;
        }

        bit >>= 1;

        if (bit == 0) {
            if (++i == 16) {
                break;
            }

            bit = 0x80;
        }
    }

    if (node == NULL) {
        return NGX_ERROR;
    }

    if (node->right || node->left) {
        if (node->value != NGX_RADIX_NO_VALUE) {
            node->value = NGX_RADIX_NO_VALUE;
            return NGX_OK;
        }

        return NGX_ERROR;
    }

    for ( ;; ) {
        if (node->parent->right == node) {
            node->parent->right = NULL;

        } else {
            node->parent->left = NULL;
        }

        node->right = tree->free;
        tree->free = node;

        node = node->parent;

        if (node->right || node->left) {
            break;
        }

        if (node->value != NGX_RADIX_NO_VALUE) {
            break;
        }

        if (node->parent == NULL) {
            break;
        }
    }

    return NGX_OK;
}